

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecFindBestVar2(Sfm_Dec_t *p,word (*Masks) [8])

{
  int iVar1;
  int iVar2;
  int local_34;
  int Cost;
  int CostBest;
  int VarBest;
  int d;
  int Counts [2] [2];
  word (*Masks_local) [8];
  Sfm_Dec_t *p_local;
  
  Cost = -1;
  local_34 = 1000000000;
  Counts[1] = (int  [2])Masks;
  for (CostBest = 0; CostBest < p->nDivs; CostBest = CostBest + 1) {
    Sfm_DecVarCost(p,(word (*) [8])Counts[1],CostBest,(int (*) [2])&VarBest);
    if (VarBest < d != Counts[0][0] < Counts[0][1]) {
      iVar1 = Abc_MinInt(VarBest,d);
      iVar2 = Abc_MinInt(Counts[0][0],Counts[0][1]);
      if (iVar1 + iVar2 < local_34) {
        Cost = CostBest;
        local_34 = iVar1 + iVar2;
      }
    }
  }
  return Cost;
}

Assistant:

int Sfm_DecFindBestVar2( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS] )
{
    int Counts[2][2];
    int d, VarBest = -1, CostBest = ABC_INFINITY, Cost;
    for ( d = 0; d < p->nDivs; d++ )
    {
        Sfm_DecVarCost( p, Masks, d, Counts );
        if ( (Counts[0][0] < Counts[0][1]) == (Counts[1][0] < Counts[1][1]) )
            continue;
        Cost = Abc_MinInt(Counts[0][0], Counts[0][1]) + Abc_MinInt(Counts[1][0], Counts[1][1]);
        if ( CostBest > Cost )
        {
            CostBest = Cost;
            VarBest = d;
        }
    }
    return VarBest;
}